

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O3

cab * __thiscall cab_manager::create(cab_manager *this,weak_ptr<cab_session> *cab_session)

{
  _Atomic_word *p_Var1;
  node_type nVar2;
  int iVar3;
  __shared_ptr<cab,(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *pmVar4;
  vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>> *this_01;
  id_type id_00;
  id_type id;
  id_type local_44;
  _Head_base<0UL,_cab_*,_false> local_40;
  weak_ptr<cab> local_38;
  
  id_00 = this->_counter;
  this->_counter = id_00 + 1;
  local_44 = id_00;
  local_40._M_head_impl = (cab *)operator_new(0x60);
  local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (cab_session->super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (cab_session->super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_weak_count + 1;
      UNLOCK();
      id_00 = local_44;
    }
    else {
      (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_weak_count + 1;
    }
  }
  cab::cab(local_40._M_head_impl,(weak_ptr<cab_session> *)&local_38,this,id_00,&this->_rnet);
  if (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_weak_count;
      (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*(local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[3])();
    }
  }
  this_00 = (__shared_ptr<cab,(__gnu_cxx::_Lock_policy)2> *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,&local_44);
  std::__shared_ptr<cab,(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,(unique_ptr<cab,_std::default_delete<cab>_> *)&local_40);
  if (local_40._M_head_impl != (cab *)0x0) {
    std::default_delete<cab>::operator()((default_delete<cab> *)&local_40,local_40._M_head_impl);
  }
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_44);
  nVar2 = cab::position((pmVar4->super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_40._M_head_impl._0_1_ = nVar2;
  this_01 = (vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>> *)
            std::
            map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
            ::operator[](&this->_cabs_at_node,(key_type *)&local_40);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_44);
  local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pmVar4->super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (pmVar4->super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_weak_count + 1;
    }
  }
  std::vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>>::
  emplace_back<std::weak_ptr<cab>>(this_01,&local_38);
  if (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_weak_count;
      (local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*(local_38.super___weak_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[3])();
    }
  }
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_44);
  return (pmVar4->super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
}

Assistant:

cab& cab_manager::create(std::weak_ptr<cab_session> cab_session)
{
    auto id = _counter++;
    _cabs[id] = std::make_unique<cab>(cab_session, *this, id, &_rnet);
    
    _cabs_at_node[_cabs[id]->position()].push_back(_cabs[id]);

    return *_cabs[id];
}